

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_encrypt(uint16_t *ciphertext,uint16_t *plaintext,uint16_t *pubkey,uint p,uint q)

{
  uint16_t *out;
  uint16_t *out_00;
  
  out = (uint16_t *)safemalloc((ulong)p,2,0);
  ntru_expand(out,plaintext,p,q);
  out_00 = (uint16_t *)safemalloc((ulong)p,2,0);
  ntru_ring_multiply(out_00,out,pubkey,p,q);
  ntru_round3(ciphertext,out_00,p,q);
  ntru_normalise(ciphertext,ciphertext,p,q);
  ring_free(out,p);
  ring_free(out_00,p);
  return;
}

Assistant:

void ntru_encrypt(uint16_t *ciphertext, const uint16_t *plaintext,
                  uint16_t *pubkey, unsigned p, unsigned q)
{
    uint16_t *r_q = snewn(p, uint16_t);
    ntru_expand(r_q, plaintext, p, q);

    uint16_t *unrounded = snewn(p, uint16_t);
    ntru_ring_multiply(unrounded, r_q, pubkey, p, q);

    ntru_round3(ciphertext, unrounded, p, q);
    ntru_normalise(ciphertext, ciphertext, p, q);

    ring_free(r_q, p);
    ring_free(unrounded, p);
}